

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  bool bVar1;
  byte local_192;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  byte local_10b;
  byte local_10a;
  allocator local_109;
  string local_108;
  byte local_e3;
  byte local_e2;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  undefined4 local_70;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  string field_name;
  ParserImpl *this_local;
  
  field_name.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"[",&local_59);
  bVar1 = TryConsume(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (bVar1) {
    bVar1 = ConsumeFullTypeName(this,(string *)local_38);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00b49d7c;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"]",&local_91);
    bVar1 = Consume(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00b49d7c;
    }
  }
  else {
    bVar1 = ConsumeIdentifier(this,(string *)local_38);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00b49d7c;
    }
  }
  std::allocator<char>::allocator();
  local_e2 = 0;
  local_e3 = 0;
  local_10a = 0;
  local_10b = 0;
  std::__cxx11::string::string((string *)&local_b8,":",&local_b9);
  bVar1 = TryConsume(this,&local_b8);
  local_192 = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string((string *)&local_e0,"{",&local_e1);
    local_e3 = 1;
    bVar1 = LookingAt(this,&local_e0);
    local_192 = 0;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_10a = 1;
      std::__cxx11::string::string((string *)&local_108,"<",&local_109);
      local_10b = 1;
      bVar1 = LookingAt(this,&local_108);
      local_192 = bVar1 ^ 0xff;
    }
  }
  if ((local_10b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_108);
  }
  if ((local_10a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  if ((local_e3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  if ((local_192 & 1) == 0) {
    bVar1 = SkipFieldMessage(this);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00b49d7c;
    }
  }
  else {
    bVar1 = SkipFieldValue(this);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00b49d7c;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,";",&local_131);
  bVar1 = TryConsume(this,&local_130);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,",",&local_159);
    TryConsume(this,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  this_local._7_1_ = true;
LAB_00b49d7c:
  local_70 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool SkipField() {
    string field_name;
    if (TryConsume("[")) {
      // Extension name.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));
    } else {
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }